

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

int __thiscall LZ77Compressor::remove(LZ77Compressor *this,char *__filename)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *this_00;
  size_type sVar2;
  reference pvVar3;
  ulong extraout_RAX;
  int in_EDX;
  size_t i;
  vector<int,_std::allocator<int>_> *v;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  value_type vVar4;
  ulong local_28;
  
  iVar1 = hash((uint8_t *)(__filename + in_EDX));
  this_00 = this->dict + iVar1;
  local_28 = 0;
  do {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(this_00);
    if (sVar2 <= local_28) {
LAB_001144cc:
      return (int)local_28;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_00,local_28);
    if (*pvVar3 == in_EDX) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      vVar4 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_00,local_28);
      *pvVar3 = vVar4;
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)0x1144b8);
      local_28 = extraout_RAX;
      goto LAB_001144cc;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void remove(const uint8_t* bytes, int offset) {
		auto& v = dict[hash(bytes + offset)];
		for (size_t i = 0; i < v.size(); i++) {
			if (v[i] == offset) {
				v[i] = v.back();
				v.pop_back();
				return;
			}
		}
	}